

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O0

HighsStatus assessHessianDimensions(HighsOptions *options,HighsHessian *hessian)

{
  int *in_RSI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  bool in_stack_00000013;
  HighsInt in_stack_00000014;
  HighsLogOptions *in_stack_00000018;
  bool partitioned;
  vector<int,_std::allocator<int>_> hessian_p_end;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  HighsStatus HVar1;
  
  if (*in_RSI == 0) {
    HVar1 = kOk;
  }
  else {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x6b7551);
    HVar1 = assessMatrixDimensions
                      (in_stack_00000018,in_stack_00000014,in_stack_00000013,in_stack_00000008,
                       unaff_retaddr,
                       (vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (vector<double,_std::allocator<double>_> *)
                       hessian_p_end.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffffc0);
  }
  return HVar1;
}

Assistant:

HighsStatus assessHessianDimensions(const HighsOptions& options,
                                    HighsHessian& hessian) {
  if (hessian.dim_ == 0) return HighsStatus::kOk;

  // Assess the Hessian dimensions and vector sizes
  vector<HighsInt> hessian_p_end;
  const bool partitioned = false;
  return assessMatrixDimensions(options.log_options, hessian.dim_, partitioned,
                                hessian.start_, hessian_p_end, hessian.index_,
                                hessian.value_);
}